

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O1

_Bool XCore_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  cs_detail *__s;
  long lVar2;
  uint8_t *puVar3;
  uint16_t uVar4;
  DecodeStatus DVar5;
  uint8_t *orig_p;
  MCRegisterClass *pMVar6;
  byte bVar7;
  void *pvVar8;
  long lVar9;
  uint uVar10;
  uint64_t Value_5;
  uint uVar11;
  ulong unaff_RBP;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint8_t *orig_p_2;
  ulong uVar16;
  byte *pbVar17;
  uint8_t *puVar18;
  uint64_t Value_1;
  int iVar19;
  int local_4c;
  
  if (1 < code_len) {
    unaff_RBP = (ulong)*(ushort *)code;
  }
  uVar11 = (uint)unaff_RBP;
  if (1 < code_len) {
    __s = MI->flat_insn->detail;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0xdc);
    }
    uVar10 = uVar11 & 0xffff;
    uVar15 = 0;
    local_4c = 3;
    puVar3 = "\x01\v\x05\x02";
LAB_00250d22:
    puVar18 = puVar3;
    switch(*puVar18) {
    case '\x01':
      uVar15 = ~(-1 << (puVar18[2] & 0x1f)) << (puVar18[1] & 0x1f);
      if (puVar18[2] == 0x10) {
        uVar15 = 0xffff;
      }
      uVar15 = (uVar15 & uVar10) >> (puVar18[1] & 0x1f);
      puVar3 = puVar18 + 3;
      goto LAB_00250d22;
    case '\x02':
      uVar13 = 0;
      lVar9 = 0;
      bVar7 = 0;
      do {
        lVar14 = uVar13 + 1;
        lVar9 = lVar9 + ((ulong)(puVar18[lVar14] & 0x7f) << (bVar7 & 0x3f));
        bVar7 = bVar7 + 7;
        uVar13 = uVar13 + 1;
      } while ((char)puVar18[lVar14] < '\0');
      puVar3 = puVar18 + (uVar13 & 0xffffffff) + 3;
      if (((uint)lVar9 & 0xffff) != uVar15) {
        puVar3 = puVar18 + (uVar13 & 0xffffffff) + 3 +
                 *(ushort *)(puVar18 + (uVar13 & 0xffffffff) + 1);
      }
      goto LAB_00250d22;
    case '\x03':
      uVar12 = ~(-1 << (puVar18[2] & 0x1f)) << (puVar18[1] & 0x1f);
      if (puVar18[2] == 0x10) {
        uVar12 = 0xffff;
      }
      uVar13 = 0;
      lVar9 = 0;
      bVar7 = 0;
      do {
        lVar14 = uVar13 + 3;
        lVar9 = lVar9 + ((ulong)(puVar18[lVar14] & 0x7f) << (bVar7 & 0x3f));
        bVar7 = bVar7 + 7;
        uVar13 = uVar13 + 1;
      } while ((char)puVar18[lVar14] < '\0');
      puVar3 = puVar18 + (uVar13 & 0xffffffff) + 5;
      if ((uVar12 & uVar10) >> (puVar18[1] & 0x1f) != (uint)lVar9) {
        puVar3 = puVar18 + (uVar13 & 0xffffffff) + 5 +
                 *(ushort *)(puVar18 + (uVar13 & 0xffffffff) + 3);
      }
      goto LAB_00250d22;
    case '\x04':
      uVar13 = 0;
      do {
        lVar9 = uVar13 + 1;
        uVar13 = uVar13 + 1;
      } while ((char)puVar18[lVar9] < '\0');
      puVar3 = puVar18 + (uVar13 & 0xffffffff) + 3;
      goto LAB_00250d22;
    case '\x05':
      goto switchD_00250d38_caseD_5;
    case '\x06':
      uVar13 = 0;
      lVar9 = 0;
      bVar7 = 0;
      do {
        lVar14 = uVar13 + 1;
        lVar9 = lVar9 + ((ulong)(puVar18[lVar14] & 0x7f) << (bVar7 & 0x3f));
        bVar7 = bVar7 + 7;
        uVar13 = uVar13 + 1;
      } while ((char)puVar18[lVar14] < '\0');
      uVar16 = 0;
      lVar14 = 0;
      bVar7 = 0;
      do {
        lVar2 = uVar16 + (uVar13 & 0xffffffff) + 1;
        lVar14 = lVar14 + ((ulong)(puVar18[lVar2] & 0x7f) << (bVar7 & 0x3f));
        bVar7 = bVar7 + 7;
        uVar16 = uVar16 + 1;
      } while ((char)puVar18[lVar2] < '\0');
      puVar3 = puVar18 + (uVar16 & 0xffffffff) + (uVar13 & 0xffffffff) + 1;
      if (((uint)lVar14 & (uVar10 ^ 0xffff)) != 0 || ((uint)lVar9 & uVar10) != 0) {
        local_4c = 1;
      }
      goto LAB_00250d22;
    default:
      goto switchD_00250d38_default;
    }
  }
  goto LAB_00251815;
switchD_002512cb_caseD_5:
  uVar13 = 0;
  lVar9 = 0;
  bVar7 = 0;
  do {
    lVar14 = uVar13 + 1;
    lVar9 = lVar9 + ((ulong)(puVar18[lVar14] & 0x7f) << (bVar7 & 0x3f));
    bVar7 = bVar7 + 7;
    uVar13 = uVar13 + 1;
  } while ((char)puVar18[lVar14] < '\0');
  pbVar17 = puVar18 + (uVar13 & 0xffffffff) + 1;
  lVar14 = 0;
  bVar7 = 0;
  do {
    bVar1 = *pbVar17;
    lVar14 = lVar14 + ((ulong)(bVar1 & 0x7f) << (bVar7 & 0x3f));
    bVar7 = bVar7 + 7;
    pbVar17 = pbVar17 + 1;
  } while ((char)bVar1 < '\0');
  MCInst_setOpcode(MI,(uint)lVar9);
  uVar15 = (int)lVar14 - 1;
  if (0x23 < uVar15) goto LAB_00251808;
  pvVar8 = (void *)((long)&switchD_002514a2::switchdataD_00554d70 +
                   (long)(int)(&switchD_002514a2::switchdataD_00554d70)[uVar15]);
  switch((int)lVar14) {
  case 1:
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar11 & 0xf,(uint64_t)info,pvVar8);
    break;
  case 2:
    DVar5 = Decode2RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 3:
    DVar5 = Decode2RUSInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 4:
    DVar5 = DecodeR2RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 5:
    DVar5 = Decode3RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 6:
    DVar5 = Decode2RImmInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 7:
    DVar5 = Decode2RSrcDstInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 8:
    DVar5 = DecodeRUSSrcDstBitpInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 9:
    DVar5 = DecodeRUSInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 10:
    DVar5 = DecodeRRegsRegisterClass(MI,uVar11 >> 6 & 0xf,(uint64_t)info,pvVar8);
    goto LAB_00251595;
  case 0xb:
    uVar13 = (ulong)(uVar11 & 0x3f);
    goto LAB_002517fb;
  case 0xc:
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar11 >> 6 & 0xf,(uint64_t)info,pvVar8);
LAB_00251595:
    if (DVar5 != MCDisassembler_Fail) {
      uVar13 = (ulong)(uVar11 & 0x3f);
      goto LAB_002517fb;
    }
    goto switchD_002512cb_default;
  case 0xd:
    uVar13 = (ulong)(uVar11 & 0x3f);
    goto LAB_002517c0;
  case 0xe:
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar11 >> 6 & 0xf,(uint64_t)info,pvVar8);
    if (DVar5 != MCDisassembler_Fail) {
      uVar11 = uVar11 & 0x3f;
LAB_0025173a:
      uVar13 = -(ulong)uVar11;
      goto LAB_002517fb;
    }
    goto switchD_002512cb_default;
  case 0xf:
    DVar5 = DecodeRUSBitpInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x10:
    DVar5 = Decode2RUSBitpInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x11:
    DVar5 = Decode3RImmInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x12:
    uVar13 = (ulong)(uVar11 & 0x3ff);
    goto LAB_002517fb;
  case 0x13:
    uVar13 = (ulong)(uVar11 & 0x3ff);
    goto LAB_002517c0;
  case 0x14:
    DVar5 = DecodeL2RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x15:
    DVar5 = DecodeL3RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x16:
    DVar5 = DecodeL4RSrcDstInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x17:
    DVar5 = DecodeL4RSrcDstSrcDstInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x18:
    DVar5 = DecodeL5RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x19:
    DVar5 = DecodeL6RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x1a:
    DVar5 = DecodeLR2RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x1b:
    DVar5 = DecodeRRegsRegisterClass(MI,uVar11 >> 0x16 & 0xf,(uint64_t)info,pvVar8);
    goto LAB_002517e4;
  case 0x1c:
    uVar15 = (uVar11 & 0x3ff) << 6;
    uVar11 = uVar11 >> 0x10 & 0x3f;
    goto LAB_002514f8;
  case 0x1d:
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar11 >> 0x16 & 0xf,(uint64_t)info,pvVar8);
LAB_002517e4:
    if (DVar5 != MCDisassembler_Fail) {
      uVar13 = (ulong)(uVar11 >> 0x10 & 0x3f | (uVar11 & 0x3ff) << 6);
      goto LAB_002517fb;
    }
    goto switchD_002512cb_default;
  case 0x1e:
    uVar15 = (uVar11 & 0x3ff) << 6;
    uVar11 = uVar11 >> 0x10 & 0x3f;
    goto LAB_002517be;
  case 0x1f:
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar11 >> 0x16 & 0xf,(uint64_t)info,pvVar8);
    if (DVar5 != MCDisassembler_Fail) {
      uVar11 = uVar11 >> 0x10 & 0x3f | (uVar11 & 0x3ff) << 6;
      goto LAB_0025173a;
    }
switchD_002512cb_default:
    iVar19 = 0;
    goto LAB_00251808;
  case 0x20:
    DVar5 = DecodeL2RUSBitpInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x21:
    DVar5 = DecodeL2RUSInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x22:
    DVar5 = DecodeL3RSrcDstInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x23:
    uVar15 = (uVar11 & 0x3ff) << 10;
    uVar11 = uVar11 >> 0x10 & 0x3ff;
LAB_002514f8:
    uVar13 = (ulong)(uVar11 | uVar15);
    goto LAB_002517fb;
  case 0x24:
    uVar15 = (uVar11 & 0x3ff) << 10;
    uVar11 = uVar11 >> 0x10 & 0x3ff;
LAB_002517be:
    uVar13 = (ulong)(uVar11 | uVar15);
LAB_002517c0:
    uVar13 = -uVar13;
LAB_002517fb:
    MCOperand_CreateImm0(MI,uVar13);
    goto LAB_00251808;
  }
  if (DVar5 == MCDisassembler_Fail) {
    iVar19 = 0;
  }
LAB_00251808:
  uVar4 = 4;
  if (iVar19 == 0) {
LAB_00251815:
    uVar15 = 0;
    goto LAB_00251817;
  }
  goto LAB_00251269;
switchD_00250d38_caseD_5:
  uVar13 = 0;
  lVar9 = 0;
  bVar7 = 0;
  do {
    lVar14 = uVar13 + 1;
    lVar9 = lVar9 + ((ulong)(puVar18[lVar14] & 0x7f) << (bVar7 & 0x3f));
    bVar7 = bVar7 + 7;
    uVar13 = uVar13 + 1;
  } while ((char)puVar18[lVar14] < '\0');
  pbVar17 = puVar18 + (uVar13 & 0xffffffff) + 1;
  lVar14 = 0;
  bVar7 = 0;
  do {
    bVar1 = *pbVar17;
    lVar14 = lVar14 + ((ulong)(bVar1 & 0x7f) << (bVar7 & 0x3f));
    bVar7 = bVar7 + 7;
    pbVar17 = pbVar17 + 1;
  } while ((char)bVar1 < '\0');
  MCInst_setOpcode(MI,(uint)lVar9);
  uVar15 = (int)lVar14 - 1;
  if (0x23 < uVar15) goto LAB_00251261;
  pvVar8 = (void *)((long)&switchD_00250f30::switchdataD_00554cc8 +
                   (long)(int)(&switchD_00250f30::switchdataD_00554cc8)[uVar15]);
  switch((int)lVar14) {
  case 1:
    uVar11 = uVar11 & 0xf;
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 2:
    DVar5 = Decode2RInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 3:
    DVar5 = Decode2RUSInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 4:
    DVar5 = DecodeR2RInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 5:
    DVar5 = Decode3RInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 6:
    DVar5 = Decode2RImmInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 7:
    DVar5 = Decode2RSrcDstInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 8:
    DVar5 = DecodeRUSSrcDstBitpInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 9:
    DVar5 = DecodeRUSInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 10:
    DVar5 = DecodeRRegsRegisterClass(MI,(uint)(unaff_RBP >> 6) & 0xf,(uint64_t)info,pvVar8);
    goto LAB_00250ffd;
  case 0xb:
    uVar16 = (ulong)(uVar11 & 0x3f);
    uVar13 = uVar16;
    goto LAB_00251258;
  case 0xc:
    DVar5 = DecodeGRRegsRegisterClass(MI,(uint)(unaff_RBP >> 6) & 0xf,(uint64_t)info,pvVar8);
LAB_00250ffd:
    if (DVar5 != MCDisassembler_Fail) {
      uVar16 = (ulong)(uVar11 & 0x3f);
      uVar13 = uVar16;
      goto LAB_00251258;
    }
switchD_00250d38_default:
    local_4c = 0;
    goto LAB_00251261;
  case 0xd:
    uVar11 = uVar11 & 0x3f;
    goto LAB_00251162;
  case 0xe:
    DVar5 = DecodeGRRegsRegisterClass(MI,(uint)(unaff_RBP >> 6) & 0xf,(uint64_t)info,pvVar8);
    if (DVar5 != MCDisassembler_Fail) {
      uVar16 = -(ulong)(uVar11 & 0x3f);
      uVar13 = uVar16;
      goto LAB_00251258;
    }
    goto switchD_00250d38_default;
  case 0xf:
    DVar5 = DecodeRUSBitpInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 0x10:
    DVar5 = Decode2RUSBitpInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 0x11:
    DVar5 = Decode3RImmInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 0x12:
    uVar16 = (ulong)(uVar11 & 0x3ff);
    uVar13 = uVar16;
    goto LAB_00251258;
  case 0x13:
    uVar11 = uVar11 & 0x3ff;
LAB_00251162:
    uVar16 = -(ulong)uVar11;
    uVar13 = uVar16;
    goto LAB_00251258;
  case 0x14:
    DVar5 = DecodeL2RInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 0x15:
    DVar5 = DecodeL3RInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 0x16:
    DVar5 = DecodeL4RSrcDstInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 0x17:
    DVar5 = DecodeL4RSrcDstSrcDstInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 0x18:
    DVar5 = DecodeL5RInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 0x19:
    DVar5 = DecodeL6RInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 0x1a:
    DVar5 = DecodeLR2RInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 0x1b:
    uVar15 = 0;
    goto LAB_00251237;
  case 0x1c:
    uVar11 = uVar11 << 6;
    goto LAB_00250f5b;
  case 0x1d:
    uVar15 = 1;
LAB_00251237:
    pMVar6 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,uVar15);
    MCOperand_CreateReg0(MI,(uint)*pMVar6->RegsBegin);
    uVar13 = (ulong)(ushort)(uVar11 << 6);
LAB_00251255:
    uVar16 = (ulong)(uVar11 << 6);
    goto LAB_00251258;
  case 0x1e:
    uVar11 = uVar11 << 6;
    goto LAB_00251223;
  case 0x1f:
    pMVar6 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,1);
    MCOperand_CreateReg0(MI,(uint)*pMVar6->RegsBegin);
    uVar13 = -(ulong)(ushort)(uVar11 << 6);
    goto LAB_00251255;
  case 0x20:
    DVar5 = DecodeL2RUSBitpInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 0x21:
    DVar5 = DecodeL2RUSInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 0x22:
    DVar5 = DecodeL3RSrcDstInstruction(MI,uVar10,(uint64_t)info,pvVar8);
    break;
  case 0x23:
    uVar11 = uVar11 << 10;
LAB_00250f5b:
    uVar16 = (ulong)uVar11;
    uVar13 = uVar16 & 0xffff;
    goto LAB_00251258;
  case 0x24:
    uVar11 = uVar11 << 10;
LAB_00251223:
    uVar16 = (ulong)uVar11;
    uVar13 = -(uVar16 & 0xffff);
LAB_00251258:
    uVar11 = (uint)uVar16;
    MCOperand_CreateImm0(MI,uVar13);
    goto LAB_00251261;
  }
  if (DVar5 == MCDisassembler_Fail) {
    local_4c = 0;
  }
LAB_00251261:
  uVar4 = 2;
  if (local_4c == 0) {
    if (3 < code_len) {
      uVar11 = *(uint *)code;
    }
    uVar15 = 0;
    if (3 < code_len) {
      iVar19 = 3;
      puVar3 = "\x01\x1b\x05\x02";
LAB_002512b5:
      puVar18 = puVar3;
      switch(*puVar18) {
      case '\x01':
        uVar15 = ~(-1 << (puVar18[2] & 0x1f)) << (puVar18[1] & 0x1f);
        if (puVar18[2] == 0x20) {
          uVar15 = 0xffffffff;
        }
        uVar15 = (uVar15 & uVar11) >> (puVar18[1] & 0x1f);
        puVar3 = puVar18 + 3;
        goto LAB_002512b5;
      case '\x02':
        uVar13 = 0;
        lVar9 = 0;
        bVar7 = 0;
        do {
          lVar14 = uVar13 + 1;
          lVar9 = lVar9 + ((ulong)(puVar18[lVar14] & 0x7f) << (bVar7 & 0x3f));
          bVar7 = bVar7 + 7;
          uVar13 = uVar13 + 1;
        } while ((char)puVar18[lVar14] < '\0');
        puVar3 = puVar18 + (uVar13 & 0xffffffff) + 3;
        if (uVar15 != (uint)lVar9) {
          puVar3 = puVar18 + (uVar13 & 0xffffffff) + 3 +
                   *(ushort *)(puVar18 + (uVar13 & 0xffffffff) + 1);
        }
        goto LAB_002512b5;
      case '\x03':
        uVar10 = ~(-1 << (puVar18[2] & 0x1f)) << (puVar18[1] & 0x1f);
        if (puVar18[2] == 0x20) {
          uVar10 = 0xffffffff;
        }
        uVar13 = 0;
        lVar9 = 0;
        bVar7 = 0;
        do {
          lVar14 = uVar13 + 3;
          lVar9 = lVar9 + ((ulong)(puVar18[lVar14] & 0x7f) << (bVar7 & 0x3f));
          bVar7 = bVar7 + 7;
          uVar13 = uVar13 + 1;
        } while ((char)puVar18[lVar14] < '\0');
        puVar3 = puVar18 + (uVar13 & 0xffffffff) + 5;
        if ((uVar10 & uVar11) >> (puVar18[1] & 0x1f) != (uint)lVar9) {
          puVar3 = puVar18 + (uVar13 & 0xffffffff) + 5 +
                   *(ushort *)(puVar18 + (uVar13 & 0xffffffff) + 3);
        }
        goto LAB_002512b5;
      case '\x04':
        uVar13 = 0;
        do {
          lVar9 = uVar13 + 1;
          uVar13 = uVar13 + 1;
        } while ((char)puVar18[lVar9] < '\0');
        puVar3 = puVar18 + (uVar13 & 0xffffffff) + 3;
        goto LAB_002512b5;
      case '\x05':
        goto switchD_002512cb_caseD_5;
      case '\x06':
        uVar13 = 0;
        lVar9 = 0;
        bVar7 = 0;
        do {
          lVar14 = uVar13 + 1;
          lVar9 = lVar9 + ((ulong)(puVar18[lVar14] & 0x7f) << (bVar7 & 0x3f));
          bVar7 = bVar7 + 7;
          uVar13 = uVar13 + 1;
        } while ((char)puVar18[lVar14] < '\0');
        uVar16 = 0;
        lVar14 = 0;
        bVar7 = 0;
        do {
          lVar2 = uVar16 + (uVar13 & 0xffffffff) + 1;
          lVar14 = lVar14 + ((ulong)(puVar18[lVar2] & 0x7f) << (bVar7 & 0x3f));
          bVar7 = bVar7 + 7;
          uVar16 = uVar16 + 1;
        } while ((char)puVar18[lVar2] < '\0');
        puVar3 = puVar18 + (uVar16 & 0xffffffff) + (uVar13 & 0xffffffff) + 1;
        if (((uint)lVar14 & ~uVar11) != 0 || ((uint)lVar9 & uVar11) != 0) {
          iVar19 = 1;
        }
        goto LAB_002512b5;
      default:
        goto switchD_002512cb_default;
      }
    }
  }
  else {
LAB_00251269:
    *size = uVar4;
    uVar15 = 1;
  }
LAB_00251817:
  return SUB41(uVar15,0);
}

Assistant:

bool XCore_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint16_t insn16;
	uint32_t insn32;
	DecodeStatus Result;

	if (!readInstruction16(code, code_len, &insn16)) {
		return false;
	}

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, xcore)+sizeof(cs_xcore));
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction_2(DecoderTable16, MI, insn16, address, info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 2;
		return true;
	}

	if (!readInstruction32(code, code_len, &insn32)) {
		return false;
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction_4(DecoderTable32, MI, insn32, address, info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 4;
		return true;
	}

	return false;
}